

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeSetPagerFlags(Btree *p,uint pgFlags)

{
  int *piVar1;
  BtShared *pBVar2;
  Pager *pPVar3;
  bool bVar4;
  int extraout_EAX;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  byte bVar8;
  bool bVar9;
  
  pBVar2 = p->pBt;
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  pPVar3 = pBVar2->pPager;
  if (pPVar3->tempFile == '\0') {
    uVar7 = pgFlags & 7;
    bVar9 = 2 < uVar7;
    pPVar3->fullSync = bVar9;
    pPVar3->extraSync = uVar7 == 4;
    pPVar3->noSync = uVar7 == 1;
    if (uVar7 != 1) {
      if ((pgFlags & 8) == 0) {
        pPVar3->syncFlags = '\x02';
        bVar8 = 2;
      }
      else {
        pPVar3->syncFlags = '\x03';
        bVar8 = 3;
      }
      bVar4 = false;
      goto LAB_001558f7;
    }
  }
  else {
    pPVar3->noSync = '\x01';
    pPVar3->fullSync = '\0';
    pPVar3->extraSync = '\0';
    bVar9 = false;
  }
  pPVar3->syncFlags = '\0';
  bVar4 = true;
  bVar8 = 0;
LAB_001558f7:
  bVar5 = bVar8;
  if (!bVar9) {
    bVar5 = 0;
  }
  bVar6 = 0xc;
  if (bVar4) {
    bVar6 = bVar8 * '\x04';
  }
  if ((pgFlags & 0x10) == 0) {
    bVar6 = bVar8 * '\x04';
  }
  pPVar3->walSyncFlags = bVar6 | bVar5;
  pPVar3->doNotSpill = pPVar3->doNotSpill & 0xfe | (pgFlags & 0x20) == 0;
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
      return extraout_EAX;
    }
  }
  return (int)pPVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSetPagerFlags(
  Btree *p,              /* The btree to set the safety level on */
  unsigned pgFlags       /* Various PAGER_* flags */
){
  BtShared *pBt = p->pBt;
  assert( sqlite3_mutex_held(p->db->mutex) );
  sqlite3BtreeEnter(p);
  sqlite3PagerSetFlags(pBt->pPager, pgFlags);
  sqlite3BtreeLeave(p);
  return SQLITE_OK;
}